

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O0

void duckdb::Vector::DebugTransformToDictionary(Vector *vector,idx_t count)

{
  VectorType VVar1;
  ulong in_RSI;
  Vector *in_RDI;
  idx_t i_2;
  SelectionVector original_sel;
  idx_t i_1;
  Vector inverted_vector;
  idx_t current_index;
  idx_t i;
  idx_t offset;
  SelectionVector inverted_sel;
  idx_t verify_count;
  idx_t in_stack_000002c8;
  Vector *in_stack_000002d0;
  Vector *in_stack_ffffffffffffff20;
  Vector *in_stack_ffffffffffffff28;
  Vector *in_stack_ffffffffffffff30;
  idx_t in_stack_ffffffffffffff38;
  ulong uVar2;
  SelectionVector *in_stack_ffffffffffffff40;
  idx_t in_stack_ffffffffffffff48;
  SelectionVector *in_stack_ffffffffffffff50;
  Vector *in_stack_ffffffffffffff58;
  Vector *in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff77;
  idx_t in_stack_ffffffffffffff78;
  Vector *in_stack_ffffffffffffff80;
  undefined8 local_40;
  
  VVar1 = GetVectorType(in_RDI);
  if (VVar1 == FLAT_VECTOR) {
    SelectionVector::SelectionVector(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    for (local_40 = 0; local_40 < in_RSI; local_40 = local_40 + 1) {
      SelectionVector::set_index
                ((SelectionVector *)in_stack_ffffffffffffff30,(idx_t)in_stack_ffffffffffffff28,
                 (idx_t)in_stack_ffffffffffffff20);
      SelectionVector::set_index
                ((SelectionVector *)in_stack_ffffffffffffff30,(idx_t)in_stack_ffffffffffffff28,
                 (idx_t)in_stack_ffffffffffffff20);
    }
    Vector(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
           in_stack_ffffffffffffff48);
    Flatten(in_stack_000002d0,in_stack_000002c8);
    for (uVar2 = 0; uVar2 < in_RSI; uVar2 = uVar2 + 1) {
      FlatVector::SetNull(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                          (bool)in_stack_ffffffffffffff77);
    }
    SelectionVector::SelectionVector(in_stack_ffffffffffffff40,uVar2);
    for (uVar2 = 0; uVar2 < in_RSI; uVar2 = uVar2 + 1) {
      SelectionVector::set_index
                ((SelectionVector *)in_stack_ffffffffffffff30,(idx_t)in_stack_ffffffffffffff28,
                 (idx_t)in_stack_ffffffffffffff20);
    }
    Slice(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
          (SelectionVector *)in_stack_ffffffffffffff20,uVar2);
    Verify(in_stack_ffffffffffffff30,(idx_t)in_stack_ffffffffffffff28);
    SelectionVector::~SelectionVector((SelectionVector *)0x2bd2132);
    ~Vector(in_stack_ffffffffffffff20);
    SelectionVector::~SelectionVector((SelectionVector *)0x2bd2149);
  }
  return;
}

Assistant:

void Vector::DebugTransformToDictionary(Vector &vector, idx_t count) {
	if (vector.GetVectorType() != VectorType::FLAT_VECTOR) {
		// only supported for flat vectors currently
		return;
	}
	// convert vector to dictionary vector
	// first create an inverted vector of twice the size with NULL values every other value
	// i.e. [1, 2, 3] is converted into [NULL, 3, NULL, 2, NULL, 1]
	idx_t verify_count = count * 2;
	SelectionVector inverted_sel(verify_count);
	idx_t offset = 0;
	for (idx_t i = 0; i < count; i++) {
		idx_t current_index = count - i - 1;
		inverted_sel.set_index(offset++, current_index);
		inverted_sel.set_index(offset++, current_index);
	}
	Vector inverted_vector(vector, inverted_sel, verify_count);
	inverted_vector.Flatten(verify_count);
	// now insert the NULL values at every other position
	for (idx_t i = 0; i < count; i++) {
		FlatVector::SetNull(inverted_vector, i * 2, true);
	}
	// construct the selection vector pointing towards the original values
	// we start at the back, (verify_count - 1) and move backwards
	SelectionVector original_sel(count);
	offset = 0;
	for (idx_t i = 0; i < count; i++) {
		original_sel.set_index(offset++, verify_count - 1 - i * 2);
	}
	// now slice the inverted vector with the inverted selection vector
	vector.Slice(inverted_vector, original_sel, count);
	vector.Verify(count);
}